

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  *(undefined ***)&this->field_0x70 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcConversionBasedUnit";
  IfcNamedUnit::IfcNamedUnit(&this->super_IfcNamedUnit,&PTR_construction_vtable_24__00812180);
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x40 = 0;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x812118;
  *(undefined8 *)&this->field_0x70 = 0x812168;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x812140;
  *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48 = &this->field_0x58;
  *(undefined8 *)&this->field_0x50 = 0;
  this->field_0x58 = 0;
  (this->ConversionFactor).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}